

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.cpp
# Opt level: O0

TExecutionResult
Refal2::COperationsExecuter::Run
          (CProgramPtr *program,CReceptaclePtr *receptacle,CUnitList *fieldOfView,
          CUnitNode **errorCall)

{
  CUnitNode **ppCVar1;
  shared_ptr<Refal2::CReceptacle> local_108;
  shared_ptr<Refal2::CProgram> local_f8;
  undefined1 local_e8 [8];
  COperationsExecuter executer;
  CUnitNode **errorCall_local;
  CUnitList *fieldOfView_local;
  CReceptaclePtr *receptacle_local;
  CProgramPtr *program_local;
  
  executer.lastAddedLeftBracket = (CUnitNode *)errorCall;
  std::shared_ptr<Refal2::CProgram>::shared_ptr(&local_f8,program);
  std::shared_ptr<Refal2::CReceptacle>::shared_ptr(&local_108,receptacle);
  COperationsExecuter((COperationsExecuter *)local_e8,&local_f8,&local_108);
  std::shared_ptr<Refal2::CReceptacle>::~shared_ptr(&local_108);
  std::shared_ptr<Refal2::CProgram>::~shared_ptr(&local_f8);
  CNodeList<Refal2::CUnit>::Move
            ((CNodeList<Refal2::CUnit> *)&executer.super_CExecutionContext.RuntimeModuleId,
             &fieldOfView->super_CNodeList<Refal2::CUnit>);
  ppCVar1 = CUnit::PairedParen((CUnit *)&executer.stackTop);
  *(CUnitNode **)&(executer.lastAddedLeftBracket)->super_CUnit = *ppCVar1;
  ~COperationsExecuter((COperationsExecuter *)local_e8);
  return executer.super_CExecutionContext.Receptacle.
         super___shared_ptr<Refal2::CReceptacle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
  ;
}

Assistant:

TExecutionResult COperationsExecuter::Run( CProgramPtr program,
	CReceptaclePtr receptacle, CUnitList& fieldOfView, CUnitNode*& errorCall )
{
	COperationsExecuter executer( program, receptacle );
	executer.fieldOfView.Move( fieldOfView );
	errorCall = executer.initialLeftBracket.PairedParen();
	return executer.executionResult;
}